

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

bool __thiscall ON_BinaryArchive::EndRead3dmUserTable(ON_BinaryArchive *this)

{
  bool bVar1;
  int iVar2;
  ON__INT64 local_30;
  ON__INT64 big_value;
  uint tcode;
  bool rc;
  ON_3DM_BIG_CHUNK *c;
  ON_BinaryArchive *this_local;
  
  c = (ON_3DM_BIG_CHUNK *)this;
  iVar2 = ON_SimpleArray<ON_3DM_BIG_CHUNK>::Count(&this->m_chunk);
  if (iVar2 == 2) {
    _tcode = ON_SimpleArray<ON_3DM_BIG_CHUNK>::Last(&this->m_chunk);
    if ((_tcode == (ON_3DM_BIG_CHUNK *)0x0) || (_tcode->m_typecode != 0x20000081)) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                 ,0x3f93,"",
                 "ON_BinaryArchive::EndRead3dmTable() m_chunk.Last()->typecode != TCODE_USER_RECORD"
                );
      this_local._7_1_ = false;
    }
    else {
      big_value._7_1_ = EndRead3dmChunk(this,true);
      if ((bool)big_value._7_1_) {
        big_value._0_4_ = 0;
        local_30 = -1;
        big_value._7_1_ = BeginRead3dmBigChunk(this,(uint *)&big_value,&local_30);
        if ((bool)big_value._7_1_) {
          if ((int)big_value != -1) {
            ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                       ,0x3fa4,"",
                       "ON_BinaryArchive::EndRead3dmTable() missing TCODE_ENDOFTABLE marker.");
          }
          bVar1 = EndRead3dmChunk(this);
          if (!bVar1) {
            big_value._7_1_ = 0;
          }
        }
      }
      bVar1 = EndRead3dmTable(this,0x10000017);
      if (!bVar1) {
        big_value._7_1_ = 0;
      }
      this_local._7_1_ = (bool)(big_value._7_1_ & 1);
    }
  }
  else {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
               ,0x3f8e,"","ON_BinaryArchive::EndRead3dmUserTable() m_chunk.Count() != 2");
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_BinaryArchive::EndRead3dmUserTable()
{
  if ( m_chunk.Count() != 2 ) {
    ON_ERROR("ON_BinaryArchive::EndRead3dmUserTable() m_chunk.Count() != 2");
    return false;
  }
  const ON_3DM_BIG_CHUNK* c = m_chunk.Last();
  if ( 0 == c || c->m_typecode != TCODE_USER_RECORD ) {
    ON_ERROR("ON_BinaryArchive::EndRead3dmTable() m_chunk.Last()->typecode != TCODE_USER_RECORD");
    return false;
  }


  // end of TCODE_USER_RECORD chunk
  // Suppress the partially read chunk warning because plug-in IO
  // is too upredictable for this warning to be helpful.
  bool rc = EndRead3dmChunk(true); 

  if (rc) {
    // end of table chunk
    unsigned int tcode = 0;
    ON__INT64 big_value = -1;
    rc = BeginRead3dmBigChunk( &tcode, &big_value );
    if ( rc ) {
      if ( tcode != TCODE_ENDOFTABLE ) {
        ON_ERROR("ON_BinaryArchive::EndRead3dmTable() missing TCODE_ENDOFTABLE marker.");
      }
      if ( !EndRead3dmChunk() )
        rc = false;
    }
  }

  if ( !EndRead3dmTable(TCODE_USER_TABLE) )
    rc = false;
  return rc;
}